

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options,bool immutable_api)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  Context *pCVar7;
  ClassNameResolver *pCVar8;
  ImmutableGeneratorFactory *this_00;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar9;
  GeneratorFactory *pGVar10;
  Descriptor *pDVar11;
  undefined4 extraout_var;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *psVar12;
  FieldDescriptor *pFVar13;
  undefined4 extraout_var_00;
  ulong uVar14;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *local_f8;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *local_b0;
  int local_60;
  int local_5c;
  int i_1;
  int i;
  byte local_21;
  Options *pOStack_20;
  bool immutable_api_local;
  Options *options_local;
  FileDescriptor *file_local;
  FileGenerator *this_local;
  
  this->file_ = file;
  local_21 = immutable_api;
  pOStack_20 = options;
  options_local = (Options *)file;
  file_local = (FileDescriptor *)this;
  FileJavaPackage_abi_cxx11_
            (&this->java_package_,(java *)file,(FileDescriptor *)(ulong)(immutable_api & 1),
             immutable_api);
  std::__cxx11::string::string((string *)&this->classname_);
  iVar3 = FileDescriptor::message_type_count((FileDescriptor *)options_local);
  uVar4 = (ulong)iVar3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  uVar14 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar14 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar14);
  *puVar6 = uVar4;
  psVar9 = (scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_b0 = psVar9;
    do {
      internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::scoped_ptr
                (local_b0,(MessageGenerator *)0x0);
      local_b0 = local_b0 + 1;
    } while (local_b0 != psVar9 + uVar4);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
  ::scoped_array(&this->message_generators_,psVar9);
  iVar3 = FileDescriptor::extension_count((FileDescriptor *)options_local);
  uVar4 = (ulong)iVar3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  uVar14 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar14 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar14);
  *puVar6 = uVar4;
  psVar12 = (scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_f8 = psVar12;
    do {
      internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::scoped_ptr
                (local_f8,(ExtensionGenerator *)0x0);
      local_f8 = local_f8 + 1;
    } while (local_f8 != psVar12 + uVar4);
  }
  internal::
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
  ::scoped_array(&this->extension_generators_,psVar12);
  internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::scoped_ptr
            (&this->generator_factory_,(GeneratorFactory *)0x0);
  pCVar7 = (Context *)operator_new(0xb0);
  Context::Context(pCVar7,(FileDescriptor *)options_local,pOStack_20);
  internal::scoped_ptr<google::protobuf::compiler::java::Context>::scoped_ptr
            (&this->context_,pCVar7);
  pCVar7 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                     (&this->context_);
  pCVar8 = Context::GetNameResolver(pCVar7);
  this->name_resolver_ = pCVar8;
  Options::Options(&this->options_,pOStack_20);
  this->immutable_api_ = (bool)(local_21 & 1);
  ClassNameResolver::GetFileClassName_abi_cxx11_
            ((string *)&i_1,this->name_resolver_,(FileDescriptor *)options_local,
             (bool)(local_21 & 1));
  std::__cxx11::string::operator=((string *)&this->classname_,(string *)&i_1);
  std::__cxx11::string::~string((string *)&i_1);
  this_00 = (ImmutableGeneratorFactory *)operator_new(0x10);
  pCVar7 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::get(&this->context_);
  ImmutableGeneratorFactory::ImmutableGeneratorFactory(this_00,pCVar7);
  internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::reset
            (&this->generator_factory_,(GeneratorFactory *)this_00);
  local_5c = 0;
  while( true ) {
    iVar3 = FileDescriptor::message_type_count(this->file_);
    if (iVar3 <= local_5c) break;
    psVar9 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
             ::operator[](&this->message_generators_,(long)local_5c);
    pGVar10 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->
                        (&this->generator_factory_);
    pDVar11 = FileDescriptor::message_type(this->file_,local_5c);
    iVar3 = (*pGVar10->_vptr_GeneratorFactory[2])(pGVar10,pDVar11);
    internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::reset
              (psVar9,(MessageGenerator *)CONCAT44(extraout_var,iVar3));
    local_5c = local_5c + 1;
  }
  local_60 = 0;
  while( true ) {
    iVar3 = FileDescriptor::extension_count(this->file_);
    if (iVar3 <= local_60) break;
    psVar12 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,(long)local_60);
    pGVar10 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->
                        (&this->generator_factory_);
    pFVar13 = FileDescriptor::extension(this->file_,local_60);
    iVar3 = (*pGVar10->_vptr_GeneratorFactory[3])(pGVar10,pFVar13);
    internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::reset
              (psVar12,(ExtensionGenerator *)CONCAT44(extraout_var_00,iVar3));
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options,
                             bool immutable_api)
    : file_(file),
      java_package_(FileJavaPackage(file, immutable_api)),
      message_generators_(
          new google::protobuf::scoped_ptr<MessageGenerator>[file->message_type_count()]),
      extension_generators_(
          new google::protobuf::scoped_ptr<ExtensionGenerator>[file->extension_count()]),
      context_(new Context(file, options)),
      name_resolver_(context_->GetNameResolver()),
      options_(options),
      immutable_api_(immutable_api) {
  classname_ = name_resolver_->GetFileClassName(file, immutable_api);
  generator_factory_.reset(
      new ImmutableGeneratorFactory(context_.get()));
  for (int i = 0; i < file_->message_type_count(); ++i) {
    message_generators_[i].reset(
        generator_factory_->NewMessageGenerator(file_->message_type(i)));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    extension_generators_[i].reset(
        generator_factory_->NewExtensionGenerator(file_->extension(i)));
  }
}